

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O1

void __thiscall
QPixmapIconEngine::paint
          (QPixmapIconEngine *this,QPainter *painter,QRect *rect,Mode mode,State state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QPaintDevice *this_00;
  long in_FS_OFFSET;
  QPixmap local_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_58.yp = local_58.xp;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QPainter::device(painter);
  if (this_00 == (QPaintDevice *)0x0) {
    QGuiApplication::devicePixelRatio(QCoreApplication::self);
  }
  else {
    QPaintDevice::devicePixelRatio(this_00);
  }
  local_98.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_98.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
  local_98.super_QPaintDevice._vptr_QPaintDevice._4_4_ = 0xaaaaaaaa;
  local_98.super_QPaintDevice.painters = 0xaaaa;
  local_98.super_QPaintDevice._10_2_ = 0xaaaa;
  local_98.super_QPaintDevice._12_4_ = 0xaaaaaaaa;
  local_58.xp._4_4_ = ((rect->y2).m_i - (rect->y1).m_i) + 1;
  local_58.xp._0_4_ = ((rect->x2).m_i - (rect->x1).m_i) + 1;
  (*(this->super_QIconEngine)._vptr_QIconEngine[0xe])
            (&local_98,this,&local_58,(ulong)mode,(ulong)state);
  uVar1 = rect->x1;
  uVar2 = rect->y1;
  local_58.yp._0_4_ = SUB84((double)(int)uVar2,0);
  local_58.xp = (double)(int)uVar1;
  local_58.yp._4_4_ = (int)((ulong)(double)(int)uVar2 >> 0x20);
  local_58.w = (qreal)(((long)(rect->x2).m_i - (long)(int)uVar1) + 1);
  local_58.h = (qreal)(((long)(rect->y2).m_i - (long)(int)uVar2) + 1);
  local_78.w = 0.0;
  local_78.h = 0.0;
  local_78.xp = 0.0;
  local_78.yp = 0.0;
  QPainter::drawPixmap(painter,&local_58,&local_98,&local_78);
  QPixmap::~QPixmap(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapIconEngine::paint(QPainter *painter, const QRect &rect, QIcon::Mode mode, QIcon::State state)
{
    auto paintDevice = painter->device();
    qreal dpr = paintDevice ? paintDevice->devicePixelRatio() : qApp->devicePixelRatio();
    QPixmap px = scaledPixmap(rect.size(), mode, state, dpr);
    painter->drawPixmap(rect, px);
}